

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_cam_b3lyp.c
# Opt level: O0

void rcam_set_ext_params(xc_func_type *p,double *ext_params)

{
  xc_func_type *p_00;
  double *in_RSI;
  xc_func_type *in_RDI;
  xc_func_type *p_01;
  double dVar1;
  double dVar2;
  char *name;
  double cb88;
  double omega;
  double beta;
  double alpha;
  double beta_libxc;
  double alpha_libxc;
  double *in_stack_ffffffffffffffb8;
  
  p_01 = (xc_func_type *)get_ext_param(in_RDI,in_RSI,0);
  dVar1 = get_ext_param(in_RDI,in_RSI,1);
  dVar2 = get_ext_param(in_RDI,in_RSI,2);
  name = (char *)get_ext_param(in_RDI,in_RSI,3);
  p_00 = (xc_func_type *)-dVar2;
  *in_RDI->mix_coef = (1.0 - (dVar1 + dVar2)) - (double)p_01;
  in_RDI->mix_coef[1] = (double)p_01 - (double)p_00;
  in_RDI->mix_coef[2] = (double)p_00;
  in_RDI->mix_coef[3] = 1.0;
  xc_func_set_ext_params_name(p_00,name,(double)p_01);
  set_ext_params_cam(p_01,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

static void
rcam_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double alpha_libxc, beta_libxc;
  double alpha, beta, omega, cb88;

  assert(p != NULL);
  /* connection is

     libxc_alpha = alpha + beta
     libxc_beta = -beta
  */
  cb88        = get_ext_param(p, ext_params, 0);
  alpha_libxc = get_ext_param(p, ext_params, 1);
  beta_libxc  = get_ext_param(p, ext_params, 2);
  omega       = get_ext_param(p, ext_params, 3);

  alpha  =  alpha_libxc + beta_libxc;
  beta   = -beta_libxc;

  p->mix_coef[0] = 1.0 - alpha - cb88;
  p->mix_coef[1] = cb88 - beta;
  p->mix_coef[2] = beta;
  p->mix_coef[3] = 1.0;

  xc_func_set_ext_params_name(p->func_aux[2], "_omega", omega);
  set_ext_params_cam(p, ext_params);
}